

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O1

int run_test_get_currentexe(void)

{
  int iVar1;
  __uid_t _Var2;
  __gid_t _Var3;
  char *pcVar4;
  anon_union_8_2_bf76bca6_for_active_reqs aVar5;
  anon_union_8_2_bf76bca6_for_active_reqs aVar6;
  undefined8 uVar7;
  anon_union_8_2_bf76bca6_for_active_reqs aVar8;
  anon_union_8_2_bf76bca6_for_active_reqs extraout_RAX;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  char *unaff_RBX;
  int iVar9;
  uv_getaddrinfo_t *__ptr;
  char *unaff_R14;
  anon_union_8_2_bf76bca6_for_active_reqs aVar10;
  undefined1 auStack_2378 [24];
  void *pvStack_2360;
  undefined1 auStack_2358 [144];
  undefined8 uStack_22c8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_22b8;
  undefined8 uStack_22a8;
  code *pcStack_22a0;
  long lStack_2298;
  long lStack_2290;
  undefined1 auStack_2288 [160];
  anon_union_8_2_bf76bca6_for_active_reqs aStack_21e8;
  size_t sStack_21d8;
  size_t sStack_21d0;
  char *pcStack_21c8;
  size_t sStack_21c0;
  undefined1 auStack_21b0 [16];
  ulong uStack_21a0;
  char *pcStack_2198;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2190;
  char *pcStack_2188;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2180;
  size_t sStack_2170;
  long lStack_2168;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2160;
  long lStack_2158;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2148;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2140;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2130;
  undefined4 uStack_2128;
  undefined4 uStack_2124;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2118;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2110;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2100;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20f8;
  anon_union_8_2_bf76bca6_for_active_reqs *paStack_20f0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20e8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20e0;
  anon_union_8_2_bf76bca6_for_active_reqs *paStack_20d8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20d0;
  char *pcStack_20c8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20c0;
  long lStack_20b8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20b0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_20a0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_2098;
  uv_handle_t **ppuStack_2090;
  uv_handle_t *puStack_2060;
  char *pcStack_2058;
  char *pcStack_2050;
  char *pcStack_2048;
  char *pcStack_2040;
  int64_t eval_b;
  int64_t eval_a;
  size_t size;
  char buffer [4096];
  char path [4096];
  
  size = 0x1000;
  pcStack_2040 = (char *)0x19c084;
  iVar1 = uv_exepath(buffer);
  if (iVar1 == 0) {
    pcStack_2040 = (char *)0x19c0a0;
    pcVar4 = realpath(executable_path,path);
    if (pcVar4 == (char *)0x0) goto LAB_0019c3bd;
    pcStack_2040 = (char *)0x19c0bb;
    pcVar4 = strstr(buffer,path);
    if (pcVar4 == (char *)0x0) {
LAB_0019c3b3:
      pcStack_2040 = (char *)0x19c3b8;
      run_test_get_currentexe_cold_17();
      goto LAB_0019c3b8;
    }
    pcStack_2040 = (char *)0x19c0d4;
    iVar1 = strcmp(pcVar4,path);
    if (iVar1 != 0) goto LAB_0019c3b3;
    eval_a = size;
    pcStack_2040 = (char *)0x19c0f0;
    eval_b = strlen(buffer);
    if (eval_a != eval_b) goto LAB_0019c3c2;
    size = 0x1000;
    pcStack_2040 = (char *)0x19c118;
    iVar1 = uv_exepath(0);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a != -0x16) goto LAB_0019c3d1;
    pcStack_2040 = (char *)0x19c144;
    iVar1 = uv_exepath(buffer,0);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a != -0x16) goto LAB_0019c3e0;
    size = 0;
    pcStack_2040 = (char *)0x19c17a;
    iVar1 = uv_exepath(buffer);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a != -0x16) goto LAB_0019c3ef;
    unaff_RBX = buffer;
    pcStack_2040 = (char *)0x19c1b1;
    memset(unaff_RBX,0xff,0x1000);
    size = 1;
    pcStack_2040 = (char *)0x19c1c5;
    iVar1 = uv_exepath(unaff_RBX);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c3fe;
    eval_a = size;
    eval_b = 0;
    if (size != 0) goto LAB_0019c40d;
    eval_a = (int64_t)buffer[0];
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c41c;
    unaff_RBX = buffer;
    pcStack_2040 = (char *)0x19c243;
    memset(unaff_RBX,0xff,0x1000);
    size = 2;
    pcStack_2040 = (char *)0x19c257;
    iVar1 = uv_exepath(unaff_RBX);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c42b;
    eval_a = 1;
    eval_b = size;
    if (size != 1) goto LAB_0019c43a;
    eval_a = (int64_t)buffer[0];
    eval_b = 0;
    if (eval_a == 0) goto LAB_0019c449;
    eval_a = (int64_t)buffer[1];
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c458;
    pcStack_2040 = (char *)0x19c2ee;
    iVar1 = uv_set_process_title("foobar");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c467;
    size = 0x1000;
    pcStack_2040 = (char *)0x19c324;
    iVar1 = uv_exepath(buffer);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) goto LAB_0019c476;
    pcStack_2040 = (char *)0x19c356;
    pcVar4 = strstr(buffer,path);
    if (pcVar4 != (char *)0x0) {
      unaff_R14 = path;
      pcStack_2040 = (char *)0x19c375;
      iVar1 = strcmp(pcVar4,unaff_R14);
      if (iVar1 != 0) goto LAB_0019c48a;
      eval_a = size;
      pcStack_2040 = (char *)0x19c391;
      eval_b = strlen(buffer);
      if (eval_a == eval_b) {
        return 0;
      }
      pcStack_2040 = (char *)0x19c4e2;
      run_test_get_currentexe_cold_14();
      puStack_2060 = (uv_handle_t *)0xbff0000000000000;
      pcStack_2058 = (char *)0xbff0000000000000;
      pcStack_2050 = (char *)0xbff0000000000000;
      pcStack_2040 = pcVar4;
      uv_loadavg(&puStack_2060);
      if ((long)(double)puStack_2060 < 0) {
        run_test_get_loadavg_cold_3();
LAB_0019c57e:
        run_test_get_loadavg_cold_2();
      }
      else {
        if ((long)(double)pcStack_2058 < 0) goto LAB_0019c57e;
        if (-1 < (long)(double)pcStack_2050) {
          return 0;
        }
      }
      run_test_get_loadavg_cold_1();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c5a8;
      ppuStack_2090 = &puStack_2060;
      aVar5.unused = (void *)uv_get_free_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c5b0;
      aVar6.unused = (void *)uv_get_total_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c5b8;
      uVar7 = uv_get_constrained_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c5c0;
      aVar8.unused = (void *)uv_get_available_memory();
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c5dd;
      printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, available_mem=%llu\n",
             aVar5.unused,aVar6.unused,uVar7,aVar8.unused);
      aStack_20a0.unused = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
      if ((long)aVar5.unused < 1) {
        aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c65a;
        aStack_2098.unused = aVar5.unused;
        run_test_get_memory_cold_1();
LAB_0019c65a:
        aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c669;
        run_test_get_memory_cold_2();
LAB_0019c669:
        aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c678;
        run_test_get_memory_cold_3();
      }
      else {
        aStack_20a0.unused = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        aStack_2098.unused = aVar6.unused;
        if ((long)aVar6.unused < 1) goto LAB_0019c65a;
        aStack_20a0.unused = aVar5.unused;
        if ((long)aVar6.unused <= (long)aVar5.unused) goto LAB_0019c669;
        aStack_20a0.unused = aVar6.unused;
        aStack_2098.unused = aVar8.unused;
        if ((long)aVar8.unused <= (long)aVar6.unused) {
          return 0;
        }
      }
      aStack_20b0 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c687;
      run_test_get_memory_cold_4();
      aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c697;
      aStack_20b0.unused = aVar6.unused;
      iVar1 = uv_os_get_passwd(&aStack_20e0);
      aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
      paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused ==
          (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c6bf;
        aStack_20e8.unused = (void *)strlen(aStack_20e0.unused);
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        if ((long)aStack_20e8.unused < 1) goto LAB_0019c8d6;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c6e5;
        aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)strlen(pcStack_20c8);
        aVar8 = aStack_20c0;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        if ((long)aStack_20e8.unused < 1) goto LAB_0019c8e3;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c70e;
        aStack_20e8.unused = (void *)strlen(aStack_20c0.unused);
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
        aVar6 = aVar8;
        if ((long)aStack_20e8.unused < 1) goto LAB_0019c8f0;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused !=
            (anon_union_8_2_bf76bca6_for_active_reqs *)0x1) {
LAB_0019c759:
          aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)
                        (long)*(char *)((long)aVar8.unused + ((long)aStack_20e8.unused - 1U));
          paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused !=
              (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f) goto LAB_0019c77b;
          goto LAB_0019c959;
        }
        aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)*aVar8.unused;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f;
        if (aStack_20e8.unused != (void *)0x2f) {
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c759;
          run_test_get_passwd_cold_6();
          aStack_20e8 = extraout_RAX;
          goto LAB_0019c759;
        }
LAB_0019c77b:
        aStack_20e8.unused = paStack_20d8;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff;
        if (paStack_20d8 == (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff)
        goto LAB_0019c8fd;
        aStack_20e8.unused = aStack_20d0.unused;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20d0.unused ==
            (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff) goto LAB_0019c90a;
        aStack_20e8.unused = paStack_20d8;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c7c4;
        _Var2 = geteuid();
        aVar8 = aStack_20d0;
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var2;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused != paStack_20f0)
        goto LAB_0019c917;
        if (paStack_20d8 == (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
LAB_0019c816:
          aVar8.unused = &aStack_20e0;
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c823;
          uv_os_free_passwd(aVar8.unused);
          if ((char *)aStack_20e0.unused != (char *)0x0) goto LAB_0019c924;
          if (pcStack_20c8 != (char *)0x0) goto LAB_0019c929;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20c0.unused !=
              (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) goto LAB_0019c92e;
          if (lStack_20b8 != 0) goto LAB_0019c933;
          aVar8.unused = &aStack_20e0;
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c866;
          uv_os_free_passwd(aVar8.unused);
          if ((char *)aStack_20e0.unused != (char *)0x0) goto LAB_0019c938;
          if (pcStack_20c8 != (char *)0x0) goto LAB_0019c93d;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20c0.unused !=
              (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) goto LAB_0019c942;
          if (lStack_20b8 != 0) goto LAB_0019c947;
          aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8a3;
          iVar1 = uv_os_get_passwd(0);
          aStack_20e8 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
          paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffffffffffea;
          if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused ==
              (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffffffffffea) {
            return 0;
          }
          goto LAB_0019c94c;
        }
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c7eb;
        _Var3 = getgid();
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aVar8.unused ==
            (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var3) goto LAB_0019c816;
        aStack_20e8.unused = aStack_20d0.unused;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c801;
        _Var3 = getegid();
        paStack_20f0 = (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var3;
        if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_20e8.unused == paStack_20f0)
        goto LAB_0019c816;
      }
      else {
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8d6;
        run_test_get_passwd_cold_1();
LAB_0019c8d6:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8e3;
        run_test_get_passwd_cold_2();
LAB_0019c8e3:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8f0;
        run_test_get_passwd_cold_3();
LAB_0019c8f0:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c8fd;
        run_test_get_passwd_cold_4();
LAB_0019c8fd:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c90a;
        run_test_get_passwd_cold_19();
LAB_0019c90a:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c917;
        run_test_get_passwd_cold_18();
LAB_0019c917:
        aVar8 = aVar6;
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c924;
        run_test_get_passwd_cold_7();
LAB_0019c924:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c929;
        run_test_get_passwd_cold_9();
LAB_0019c929:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c92e;
        run_test_get_passwd_cold_10();
LAB_0019c92e:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c933;
        run_test_get_passwd_cold_11();
LAB_0019c933:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c938;
        run_test_get_passwd_cold_12();
LAB_0019c938:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c93d;
        run_test_get_passwd_cold_13();
LAB_0019c93d:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c942;
        run_test_get_passwd_cold_14();
LAB_0019c942:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c947;
        run_test_get_passwd_cold_15();
LAB_0019c947:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c94c;
        run_test_get_passwd_cold_16();
LAB_0019c94c:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c959;
        run_test_get_passwd_cold_17();
LAB_0019c959:
        aStack_20f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c966;
        run_test_get_passwd_cold_5();
      }
      aStack_20f8.unused = run_test_get_passwd2;
      run_test_get_passwd_cold_8();
      aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c984;
      aStack_2100 = aVar8;
      aStack_20f8.unused = aVar5.unused;
      iVar1 = uv_os_get_passwd(&aStack_2130);
      aStack_2160 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
      sStack_2170 = 0;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_2160.unused ==
          (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19c9b2;
        iVar1 = uv_os_get_passwd2(&aStack_2160,uStack_2128);
        aVar6 = aStack_2160;
        sStack_2170 = (size_t)iVar1;
        lStack_2168 = 0;
        if (sStack_2170 != 0) goto LAB_0019cb70;
        sStack_2170 = CONCAT44(uStack_2124,uStack_2128);
        lStack_2168 = lStack_2158;
        if (sStack_2170 != lStack_2158) goto LAB_0019cb7f;
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca0b;
        iVar1 = strcmp((char *)aStack_2130.unused,(char *)aStack_2160.unused);
        aVar10 = aStack_2148;
        aVar8 = aStack_2130;
        aVar5 = aVar6;
        if (iVar1 == 0) {
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca28;
          iVar1 = strcmp((char *)aStack_2118.unused,(char *)aStack_2148.unused);
          aVar6 = aStack_2140;
          if (iVar1 != 0) {
            pcStack_2198 = "pwd2.shell";
            pcVar4 = "pwd.shell";
            uVar7 = 0x83;
            aStack_2110 = aStack_2118;
            goto LAB_0019cc28;
          }
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca45;
          iVar1 = strcmp((char *)aStack_2110.unused,(char *)aStack_2140.unused);
          if (iVar1 != 0) {
            pcStack_2198 = "pwd2.homedir";
            pcVar4 = "pwd.homedir";
            uVar7 = 0x84;
            aVar10 = aVar6;
            goto LAB_0019cc28;
          }
          aVar6.unused = &aStack_2160;
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca5a;
          uv_os_free_passwd(aVar6.unused);
          aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca64;
          iVar1 = uv_os_get_passwd2(aVar6.unused,0);
          aVar5 = aStack_2160;
          sStack_2170 = (size_t)iVar1;
          lStack_2168 = 0;
          if (sStack_2170 == 0) {
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19ca91;
            sStack_2170 = strlen((char *)aStack_2160.unused);
            lStack_2168 = 0;
            aVar6 = aVar5;
            if ((long)sStack_2170 < 1) goto LAB_0019cc4e;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cabe;
            iVar1 = strcmp((char *)aVar5.unused,"root");
            if (iVar1 != 0) goto LAB_0019cc5d;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cad0;
            sStack_2170 = strlen((char *)aStack_2140.unused);
            lStack_2168 = 0;
            if ((long)sStack_2170 < 1) goto LAB_0019cc65;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19caf8;
            sStack_2170 = strlen((char *)aStack_2148.unused);
            lStack_2168 = 0;
            if ((long)sStack_2170 < 1) goto LAB_0019cc74;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb20;
            uv_os_free_passwd(&aStack_2160);
            aVar6.unused = &aStack_2130;
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb2d;
            uv_os_free_passwd(aVar6.unused);
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb37;
            iVar1 = uv_os_get_passwd2(0,uStack_2128);
            sStack_2170 = (size_t)iVar1;
            lStack_2168 = 0xffffffffffffffea;
            if (sStack_2170 == 0xffffffffffffffea) {
              return 0;
            }
          }
          else {
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc4e;
            run_test_get_passwd2_cold_4();
LAB_0019cc4e:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc5d;
            run_test_get_passwd2_cold_5();
LAB_0019cc5d:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc65;
            run_test_get_passwd2_cold_6();
LAB_0019cc65:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc74;
            run_test_get_passwd2_cold_7();
LAB_0019cc74:
            aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc83;
            run_test_get_passwd2_cold_8();
          }
          aStack_2180.unused = run_test_get_group;
          run_test_get_passwd2_cold_9();
          aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cca1;
          aStack_2180 = aVar6;
          iVar1 = uv_os_get_passwd(auStack_21b0);
          pcStack_21c8 = (char *)(long)iVar1;
          sStack_21d8 = 0;
          if (pcStack_21c8 == (char *)0x0) {
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cccf;
            iVar1 = uv_os_get_group(&pcStack_21c8,uStack_21a0 & 0xffffffff);
            sStack_21d8 = (size_t)iVar1;
            sStack_21d0 = 0;
            if (sStack_21d8 != 0) goto LAB_0019cd8b;
            sStack_21d8 = uStack_21a0;
            sStack_21d0 = sStack_21c0;
            if (uStack_21a0 != sStack_21c0) goto LAB_0019cd9a;
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd1d;
            sStack_21d8 = strlen(pcStack_21c8);
            sStack_21d0 = 0;
            if ((long)sStack_21d8 < 1) goto LAB_0019cda9;
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd41;
            uv_os_free_group(&pcStack_21c8);
            aVar6.unused = auStack_21b0;
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd4e;
            uv_os_free_passwd(aVar6.unused);
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd58;
            iVar1 = uv_os_get_group(0,uStack_21a0 & 0xffffffff);
            sStack_21d8 = (size_t)iVar1;
            sStack_21d0 = 0xffffffffffffffea;
            if (sStack_21d8 == 0xffffffffffffffea) {
              return 0;
            }
          }
          else {
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd8b;
            run_test_get_group_cold_1();
LAB_0019cd8b:
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cd9a;
            run_test_get_group_cold_2();
LAB_0019cd9a:
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cda9;
            run_test_get_group_cold_3();
LAB_0019cda9:
            aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cdb8;
            run_test_get_group_cold_4();
          }
          aStack_21e8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cdc7;
          run_test_get_group_cold_5();
          iVar9 = (int)&lStack_2298;
          lStack_2290 = -0x16;
          pcStack_22a0 = (code *)0x19cdde;
          aStack_21e8 = aVar6;
          uVar7 = uv_default_loop();
          pcStack_22a0 = (code *)0x19cdfa;
          iVar1 = uv_getaddrinfo(uVar7,auStack_2288,abort,0,0,0);
          lStack_2298 = (long)iVar1;
          if (lStack_2290 == lStack_2298) {
            pcStack_22a0 = (code *)0x19ce14;
            uVar7 = uv_default_loop();
            pcStack_22a0 = (code *)0x19ce35;
            iVar1 = uv_getaddrinfo(uVar7,auStack_2288,getaddrinfo_fail_cb,"example.invalid.",0,0);
            lStack_2290 = (long)iVar1;
            lStack_2298 = 0;
            if (lStack_2290 != 0) goto LAB_0019cf0a;
            pcStack_22a0 = (code *)0x19ce58;
            uVar7 = uv_default_loop();
            pcStack_22a0 = (code *)0x19ce62;
            iVar1 = uv_run(uVar7,0);
            lStack_2290 = (long)iVar1;
            lStack_2298 = 0;
            if (lStack_2290 != 0) goto LAB_0019cf17;
            lStack_2290 = 1;
            lStack_2298 = (long)fail_cb_called;
            if (lStack_2298 != 1) goto LAB_0019cf24;
            pcStack_22a0 = (code *)0x19cea8;
            aVar6.unused = (void *)uv_default_loop();
            pcStack_22a0 = (code *)0x19cebc;
            uv_walk(aVar6.unused,close_walk_cb,0);
            pcStack_22a0 = (code *)0x19cec6;
            uv_run(aVar6.unused,0);
            lStack_2290 = 0;
            pcStack_22a0 = (code *)0x19ced4;
            uVar7 = uv_default_loop();
            pcStack_22a0 = (code *)0x19cedc;
            iVar1 = uv_loop_close(uVar7);
            lStack_2298 = (long)iVar1;
            if (lStack_2290 == lStack_2298) {
              pcStack_22a0 = (code *)0x19cef2;
              uv_library_shutdown();
              return 0;
            }
          }
          else {
            pcStack_22a0 = (code *)0x19cf0a;
            run_test_getaddrinfo_fail_cold_1();
LAB_0019cf0a:
            pcStack_22a0 = (code *)0x19cf17;
            run_test_getaddrinfo_fail_cold_2();
LAB_0019cf17:
            pcStack_22a0 = (code *)0x19cf24;
            run_test_getaddrinfo_fail_cold_3();
LAB_0019cf24:
            pcStack_22a0 = (code *)0x19cf31;
            run_test_getaddrinfo_fail_cold_4();
          }
          pcStack_22a0 = getaddrinfo_fail_cb;
          run_test_getaddrinfo_fail_cold_5();
          pcStack_22a0 = (code *)(long)fail_cb_called;
          uStack_22a8 = 0;
          if (pcStack_22a0 == (code *)0x0) {
            pcStack_22a0 = (code *)(long)iVar9;
            uStack_22a8 = 0;
            if (-1 < (long)pcStack_22a0) goto LAB_0019cfa6;
            if (extraout_RDX == 0) {
              aStack_22b8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cf8c;
              iVar1 = uv_freeaddrinfo(0);
              fail_cb_called = fail_cb_called + 1;
              return iVar1;
            }
          }
          else {
            aStack_22b8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cfa6;
            getaddrinfo_fail_cb_cold_1();
LAB_0019cfa6:
            aStack_22b8 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cfb5;
            getaddrinfo_fail_cb_cold_2();
          }
          aStack_22b8.unused = run_test_getaddrinfo_fail_sync;
          getaddrinfo_fail_cb_cold_3();
          pvStack_2360 = (void *)0x0;
          auStack_2378._8_8_ = (uv_loop_t *)0x19cfd3;
          aStack_22b8 = aVar6;
          uVar7 = uv_default_loop();
          auStack_2378._8_8_ = (uv_loop_t *)0x19cfef;
          iVar1 = uv_getaddrinfo(uVar7,auStack_2358,0,"example.invalid.",0,0);
          auStack_2378._16_8_ = SEXT48(iVar1);
          if ((long)auStack_2378._16_8_ < (long)pvStack_2360) {
            auStack_2378._8_8_ = (uv_loop_t *)0x19d00d;
            uv_freeaddrinfo(uStack_22c8);
            auStack_2378._8_8_ = (uv_loop_t *)0x19d012;
            aVar6.unused = (void *)uv_default_loop();
            auStack_2378._8_8_ = (uv_loop_t *)0x19d026;
            uv_walk(aVar6.unused,close_walk_cb,0);
            auStack_2378._8_8_ = (uv_loop_t *)0x19d030;
            uv_run(aVar6.unused,0);
            pvStack_2360 = (void *)0x0;
            auStack_2378._8_8_ = (uv_loop_t *)0x19d03e;
            uVar7 = uv_default_loop();
            auStack_2378._8_8_ = (uv_loop_t *)0x19d046;
            iVar1 = uv_loop_close(uVar7);
            auStack_2378._16_8_ = SEXT48(iVar1);
            if (pvStack_2360 == (void *)auStack_2378._16_8_) {
              auStack_2378._8_8_ = (uv_loop_t *)0x19d05c;
              uv_library_shutdown();
              return 0;
            }
          }
          else {
            auStack_2378._8_8_ = (uv_loop_t *)0x19d074;
            run_test_getaddrinfo_fail_sync_cold_1();
          }
          auStack_2378._8_8_ = run_test_getaddrinfo_basic;
          run_test_getaddrinfo_fail_sync_cold_2();
          auStack_2378._8_8_ = aVar6;
          getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
          uVar7 = uv_default_loop();
          iVar1 = uv_getaddrinfo(uVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
          auStack_2378._0_8_ = SEXT48(iVar1);
          if ((void *)auStack_2378._0_8_ == (void *)0x0) {
            uVar7 = uv_default_loop();
            uv_run(uVar7,0);
            auStack_2378._0_8_ = (void *)0x1;
            if (getaddrinfo_cbs == 1) {
              aVar6.unused = (void *)uv_default_loop();
              uv_walk(aVar6.unused,close_walk_cb,0);
              uv_run(aVar6.unused,0);
              auStack_2378._0_8_ = (void *)0x0;
              uVar7 = uv_default_loop();
              iVar1 = uv_loop_close(uVar7);
              if ((void *)auStack_2378._0_8_ == (void *)(long)iVar1) {
                uv_library_shutdown();
                return 0;
              }
              goto LAB_0019d17c;
            }
          }
          else {
            run_test_getaddrinfo_basic_cold_1();
          }
          run_test_getaddrinfo_basic_cold_2();
LAB_0019d17c:
          __ptr = (uv_getaddrinfo_t *)auStack_2378;
          run_test_getaddrinfo_basic_cold_3();
          if (getaddrinfo_handle == __ptr) {
            getaddrinfo_cbs = getaddrinfo_cbs + 1;
            free(__ptr);
            iVar1 = uv_freeaddrinfo(extraout_RDX_00);
            return iVar1;
          }
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getaddrinfo.c"
                  ,0x36,"handle","==","getaddrinfo_handle",__ptr,"==",getaddrinfo_handle,
                  aVar6.unused);
          abort();
        }
      }
      else {
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb70;
        run_test_get_passwd2_cold_1();
LAB_0019cb70:
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb7f;
        run_test_get_passwd2_cold_2();
LAB_0019cb7f:
        aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cb8e;
        run_test_get_passwd2_cold_3();
      }
      aVar10 = aVar5;
      aStack_2110 = aVar8;
      pcStack_2198 = "pwd2.username";
      pcVar4 = "pwd.username";
      uVar7 = 0x82;
LAB_0019cc28:
      pcStack_2188 = "==";
      uStack_21a0 = 0x19cc36;
      aStack_2190 = aStack_2110;
      aStack_2180 = aVar10;
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
              ,uVar7,pcVar4);
      aStack_2180 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19cc3f;
      abort();
    }
  }
  else {
LAB_0019c3b8:
    pcStack_2040 = (char *)0x19c3bd;
    run_test_get_currentexe_cold_1();
LAB_0019c3bd:
    pcStack_2040 = (char *)0x19c3c2;
    run_test_get_currentexe_cold_18();
LAB_0019c3c2:
    pcStack_2040 = (char *)0x19c3d1;
    run_test_get_currentexe_cold_2();
LAB_0019c3d1:
    pcStack_2040 = (char *)0x19c3e0;
    run_test_get_currentexe_cold_3();
LAB_0019c3e0:
    pcStack_2040 = (char *)0x19c3ef;
    run_test_get_currentexe_cold_4();
LAB_0019c3ef:
    pcStack_2040 = (char *)0x19c3fe;
    run_test_get_currentexe_cold_5();
LAB_0019c3fe:
    pcStack_2040 = (char *)0x19c40d;
    run_test_get_currentexe_cold_6();
LAB_0019c40d:
    pcStack_2040 = (char *)0x19c41c;
    run_test_get_currentexe_cold_7();
LAB_0019c41c:
    pcStack_2040 = (char *)0x19c42b;
    run_test_get_currentexe_cold_8();
LAB_0019c42b:
    pcStack_2040 = (char *)0x19c43a;
    run_test_get_currentexe_cold_9();
LAB_0019c43a:
    pcStack_2040 = (char *)0x19c449;
    run_test_get_currentexe_cold_10();
LAB_0019c449:
    pcStack_2040 = (char *)0x19c458;
    run_test_get_currentexe_cold_16();
LAB_0019c458:
    pcStack_2040 = (char *)0x19c467;
    run_test_get_currentexe_cold_11();
LAB_0019c467:
    pcStack_2040 = (char *)0x19c476;
    run_test_get_currentexe_cold_12();
LAB_0019c476:
    pcStack_2040 = (char *)0x19c485;
    run_test_get_currentexe_cold_13();
  }
  pcVar4 = unaff_RBX;
  pcStack_2040 = (char *)0x19c48a;
  run_test_get_currentexe_cold_15();
LAB_0019c48a:
  pcStack_2048 = "==";
  pcStack_2058 = "path";
  puStack_2060 = (uv_handle_t *)0x19c4ca;
  pcStack_2050 = pcVar4;
  pcStack_2040 = unaff_R14;
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
          ,0x6a,"match");
  pcStack_2040 = (char *)0x19c4d3;
  abort();
}

Assistant:

TEST_IMPL(get_currentexe) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif

  char buffer[PATHMAX];
  char path[PATHMAX];
  size_t size;
  char* match;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

#ifdef _WIN32
  snprintf(path, sizeof(path), "%s", executable_path);
#else
  ASSERT_NOT_NULL(realpath(executable_path, path));
#endif

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT_EQ(size, strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT_EQ(r, UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT_EQ(r, UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_OK(size);
  ASSERT_EQ(buffer[0], '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_EQ(1, size);
  ASSERT_NE(buffer[0], '\0');
  ASSERT_EQ(buffer[1], '\0');

  /* Verify uv_exepath is not affected by uv_set_process_title(). */
  r = uv_set_process_title("foobar");
  ASSERT_OK(r);
  size = sizeof(buffer);
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT_NOT_NULL(match);
  ASSERT_STR_EQ(match, path);
  ASSERT_EQ(size, strlen(buffer));
  return 0;
}